

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.h
# Opt level: O2

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator=(XmlRpcValue *this,char *rhs)

{
  XmlRpcValue *pXVar1;
  allocator<char> local_41;
  XmlRpcValue local_40;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,rhs,&local_41);
  XmlRpcValue(&local_40,&local_30);
  pXVar1 = operator=(this,&local_40);
  ~XmlRpcValue(&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  return pXVar1;
}

Assistant:

XmlRpcValue& operator=(const char* rhs) { return operator=(XmlRpcValue(std::string(rhs))); }